

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemMap.cpp
# Opt level: O1

void __thiscall MemMap::MemMap(MemMap *this,MemMap *other)

{
  (this->fname)._M_dataplus._M_p = (pointer)&(this->fname).field_2;
  (this->fname)._M_string_length = 0;
  (this->fname).field_2._M_local_buf[0] = '\0';
  this->fd = other->fd;
  std::__cxx11::string::_M_assign((string *)&this->fname);
  this->fsize = other->fsize;
  this->mmap_ptr = other->mmap_ptr;
  other->mmap_ptr = (uint8_t *)0x0;
  other->fd = -1;
  return;
}

Assistant:

MemMap::MemMap(MemMap &&other) {
    this->fd = other.fd;
    this->fname = other.fname;
    this->fsize = other.fsize;
    this->mmap_ptr = other.mmap_ptr;

    other.mmap_ptr = nullptr;
    other.fd = -1;
}